

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcFindFunctionIndex(char *name)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  if (NULLC::linker == 0) {
    NULLC::nullcLastError = "ERROR: NULLC cannot find linked code";
  }
  else if (name == (char *)0x0) {
    NULLC::nullcLastError = "ERROR: function name is \'null\'";
  }
  else {
    uVar2 = NULLC::GetStringHash(name);
    uVar1 = *(uint *)(NULLC::linker + 0x24c);
    if ((ulong)uVar1 == 0) {
      uVar4 = 0xffffffff;
    }
    else {
      piVar3 = (int *)(*(long *)(NULLC::linker + 0x240) + 0x18);
      uVar4 = 0xffffffff;
      uVar5 = 0;
      do {
        if ((*piVar3 != 0) && (piVar3[0x19] == uVar2)) {
          if (uVar4 != 0xffffffff) {
            NULLC::nullcLastError = "ERROR: there is more than one function with the same name";
            return 0xffffffff;
          }
          uVar4 = (uint)uVar5;
        }
        uVar5 = uVar5 + 1;
        piVar3 = piVar3 + 0x25;
      } while (uVar1 != uVar5);
    }
    if (uVar4 == 0xffffffff) {
      NULLC::nullcLastError = "ERROR: function with such name cannot be found";
    }
    else {
      if (uVar1 <= uVar4) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      if (*(char *)(*(long *)(NULLC::linker + 0x240) + 0x35 + (ulong)uVar4 * 0x94) == '\0') {
        return uVar4;
      }
      NULLC::nullcLastError = "ERROR: function uses context, which is unavailable";
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcFindFunctionIndex(const char* name)
{
	using namespace NULLC;

	if(!linker)
	{
		nullcLastError = "ERROR: NULLC cannot find linked code";
		return ~0u;
	}
	if(!name)
	{
		nullcLastError = "ERROR: function name is 'null'";
		return ~0u;
	}
	unsigned hash = GetStringHash(name);
	unsigned index = ~0u;
	for(unsigned i = 0; i < linker->exFunctions.size(); i++)
	{
		if(linker->exFunctions[i].isVisible && linker->exFunctions[i].nameHash == hash)
		{
			if(index != ~0u)
			{
				nullcLastError = "ERROR: there is more than one function with the same name";
				return ~0u;
			}
			index = i;
		}
	}
	if(index == ~0u)
	{
		nullcLastError = "ERROR: function with such name cannot be found";
		return ~0u;
	}
	if(linker->exFunctions[index].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: function uses context, which is unavailable";
		return ~0u;
	}
	return index;
}